

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TokenizerTests.cpp
# Opt level: O0

void __thiscall
TokenizerTest_Keywords_Test::~TokenizerTest_Keywords_Test(TokenizerTest_Keywords_Test *this)

{
  void *in_RDI;
  
  ~TokenizerTest_Keywords_Test((TokenizerTest_Keywords_Test *)0x1c3428);
  operator_delete(in_RDI,0x10);
  return;
}

Assistant:

TEST(TokenizerTest, Keywords)
{
  std::stringstream stream{"f32 if print fn let void ret function"};
  std::vector<std::pair<std::string, TokenType>> tokensInfo {
    std::make_pair("f32", TokenType::KeywordF32), 
    std::make_pair("if", TokenType::KeywordIf), 
    std::make_pair("print", TokenType::KeywordPrint), 
    std::make_pair("fn", TokenType::KeywordFn), 
    std::make_pair("let", TokenType::KeywordLet),
    std::make_pair("void", TokenType::KeywordVoid),
    std::make_pair("ret", TokenType::KeywordRet),
    std::make_pair("function", TokenType::KeywordFunction)
  };

  Tokenizer tokenizer{stream};
  for(const auto& tokenInfo : tokensInfo)
  {
    auto token = tokenizer.peek();
    EXPECT_FALSE(tokenizer.end());
    EXPECT_EQ(token.type, tokenInfo.second);
    ASSERT_TRUE(std::holds_alternative<std::string>(token.value));
    EXPECT_EQ(std::get<std::string>(token.value), tokenInfo.first);

    EXPECT_FALSE(Token::isArithmeticOperator(token));
    EXPECT_FALSE(Token::isAssigmentOperator(token));
    EXPECT_FALSE(Token::isBinaryOperator(token));
    EXPECT_FALSE(Token::isComparisonOperator(token));
    EXPECT_FALSE(Token::isLogicalOperator(token));

    tokenizer.nextToken();
  }
  EXPECT_EQ(tokenizer.peek(), Token());
  EXPECT_TRUE(tokenizer.end());
}